

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O1

void __thiscall
rr::TriangleRasterizer::rasterizeSingleSample
          (TriangleRasterizer *this,FragmentPacket *fragmentPackets,float *depthValues,
          int maxFragmentPackets,int *numPacketsRasterized)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  bool bVar14;
  int i_1;
  int iVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  int i;
  long lVar24;
  float fVar25;
  float fVar26;
  Vec4 e20f;
  Vec4 e12f;
  Vec4 bSum;
  Vec4 e01f;
  Vector<long,_4> e20;
  Vector<long,_4> e12;
  Vector<long,_4> e01;
  Vector<float,_4> res_14;
  deInt64 sy [4];
  deInt64 sx [4];
  float local_1b8 [4];
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  float local_188 [20];
  float local_138 [16];
  long local_f8 [14];
  float local_88 [4];
  long local_78;
  Vec4 z0;
  Vector<float,_4> res_10;
  Vec4 z1;
  Vec4 edgeSum;
  
  iVar3 = (this->m_curPos).m_data[1];
  iVar22 = 0;
  if (0 < maxFragmentPackets && iVar3 <= (this->m_bboxMax).m_data[1]) {
    fVar1 = (this->m_v2).m_data[2];
    fVar25 = (this->m_v0).m_data[2] - fVar1;
    fVar26 = (this->m_v1).m_data[2] - fVar1;
    iVar22 = 0;
    do {
      iVar4 = (this->m_curPos).m_data[0];
      lVar16 = (long)(int)(iVar4 << 8 | 0x80);
      local_78 = (long)(int)(iVar3 << 8 | 0x80);
      iVar21 = iVar3 + 1;
      lVar23 = (long)(int)(iVar21 * 0x100 | 0x80);
      res_10.m_data[2] = (float)(int)lVar16;
      res_10.m_data[3] = (float)(int)((ulong)lVar16 >> 0x20);
      z0.m_data[0] = (float)(int)local_78;
      z0.m_data[1] = (float)(int)((ulong)local_78 >> 0x20);
      z0.m_data[2] = (float)(int)lVar23;
      z0.m_data[3] = (float)(int)((ulong)lVar23 >> 0x20);
      res_10.m_data[0] = (float)(int)lVar23;
      res_10.m_data[1] = (float)(int)((ulong)lVar23 >> 0x20);
      iVar19 = (this->m_viewport).m_data[2] + (this->m_viewport).m_data[0];
      iVar15 = (this->m_viewport).m_data[3] + (this->m_viewport).m_data[1];
      local_f8[10] = 0;
      local_f8[0xb] = 0;
      local_f8[8] = 0;
      local_f8[9] = 0;
      local_f8[6] = 0;
      local_f8[7] = 0;
      local_f8[4] = 0;
      local_f8[5] = 0;
      local_f8[2] = 0;
      local_f8[3] = 0;
      local_f8[0] = 0;
      local_f8[1] = 0;
      lVar16 = (this->m_edge01).a;
      lVar23 = (this->m_edge01).b;
      lVar5 = (this->m_edge01).c;
      lVar6 = (this->m_edge12).a;
      lVar7 = (this->m_edge12).b;
      lVar8 = (this->m_edge12).c;
      lVar9 = (this->m_edge20).a;
      lVar10 = (this->m_edge20).b;
      lVar11 = (this->m_edge20).c;
      lVar24 = 0;
      do {
        lVar12 = *(long *)(res_10.m_data + lVar24 * 2 + 2);
        lVar13 = *(long *)(z0.m_data + lVar24 * 2 + -2);
        local_f8[lVar24 + 8] = lVar23 * lVar13 + lVar16 * lVar12 + lVar5;
        local_f8[lVar24 + 4] = lVar7 * lVar13 + lVar6 * lVar12 + lVar8;
        local_f8[lVar24] = lVar13 * lVar10 + lVar12 * lVar9 + lVar11;
        lVar24 = lVar24 + 1;
      } while (lVar24 != 4);
      uVar18 = (ulong)(this->m_edge01).inclusive;
      lVar16 = -uVar18;
      if (local_f8[8] == lVar16 || SBORROW8(local_f8[8],lVar16) != (long)(local_f8[8] + uVar18) < 0)
      {
        uVar17 = 0;
      }
      else {
        uVar17 = (ulong)(this->m_edge12).inclusive;
        lVar23 = -uVar17;
        if (local_f8[4] == lVar23 ||
            SBORROW8(local_f8[4],lVar23) != (long)(local_f8[4] + uVar17) < 0) {
          uVar17 = 0;
        }
        else {
          uVar17 = (ulong)(this->m_edge20).inclusive;
          lVar23 = -uVar17;
          uVar17 = (ulong)(local_f8[0] != lVar23 &&
                          SBORROW8(local_f8[0],lVar23) == (long)(local_f8[0] + uVar17) < 0);
        }
      }
      bVar14 = false;
      if ((iVar4 + 1 != iVar19) &&
         (local_f8[9] != lVar16 && SBORROW8(local_f8[9],lVar16) == (long)(local_f8[9] + uVar18) < 0)
         ) {
        uVar20 = (ulong)(this->m_edge12).inclusive;
        lVar23 = -uVar20;
        if (local_f8[5] == lVar23 ||
            SBORROW8(local_f8[5],lVar23) != (long)(local_f8[5] + uVar20) < 0) {
          bVar14 = false;
        }
        else {
          uVar20 = (ulong)(this->m_edge20).inclusive;
          lVar23 = -uVar20;
          bVar14 = local_f8[1] != lVar23 &&
                   SBORROW8(local_f8[1],lVar23) == (long)(local_f8[1] + uVar20) < 0;
        }
      }
      uVar20 = uVar17 + 4;
      if (!bVar14) {
        uVar20 = uVar17;
      }
      bVar14 = false;
      if ((iVar21 != iVar15) &&
         (local_f8[10] != lVar16 &&
          SBORROW8(local_f8[10],lVar16) == (long)(local_f8[10] + uVar18) < 0)) {
        uVar17 = (ulong)(this->m_edge12).inclusive;
        lVar23 = -uVar17;
        if (local_f8[6] == lVar23 ||
            SBORROW8(local_f8[6],lVar23) != (long)(local_f8[6] + uVar17) < 0) {
          bVar14 = false;
        }
        else {
          uVar17 = (ulong)(this->m_edge20).inclusive;
          lVar23 = -uVar17;
          bVar14 = local_f8[2] != lVar23 &&
                   SBORROW8(local_f8[2],lVar23) == (long)(local_f8[2] + uVar17) < 0;
        }
      }
      uVar17 = uVar20 | 2;
      if (!bVar14) {
        uVar17 = uVar20;
      }
      if ((iVar4 + 1 == iVar19) || (iVar21 == iVar15)) {
LAB_019a9fad:
        uVar20 = 0;
      }
      else {
        uVar20 = 0;
        if (local_f8[0xb] != lVar16 &&
            SBORROW8(local_f8[0xb],lVar16) == (long)(local_f8[0xb] + uVar18) < 0) {
          uVar18 = (ulong)(this->m_edge12).inclusive;
          lVar16 = -uVar18;
          if (local_f8[7] == lVar16 ||
              SBORROW8(local_f8[7],lVar16) != (long)(local_f8[7] + uVar18) < 0) goto LAB_019a9fad;
          uVar18 = (ulong)(this->m_edge20).inclusive;
          lVar16 = -uVar18;
          uVar20 = (ulong)(local_f8[3] != lVar16 &&
                          SBORROW8(local_f8[3],lVar16) == (long)(local_f8[3] + uVar18) < 0) << 3;
        }
      }
      (this->m_curPos).m_data[0] = iVar4 + 2;
      if ((this->m_bboxMax).m_data[0] < iVar4 + 2) {
        (this->m_curPos).m_data[1] = iVar3 + 2;
        (this->m_curPos).m_data[0] = (this->m_bboxMin).m_data[0];
      }
      if ((uVar20 | uVar17) != 0) {
        local_138[0xc] = 0.0;
        local_138[0xd] = 0.0;
        local_138[0xe] = 0.0;
        local_138[0xf] = 0.0;
        lVar16 = 0;
        do {
          local_138[lVar16 + 0xc] = (float)local_f8[lVar16 + 8];
          lVar16 = lVar16 + 1;
        } while (lVar16 != 4);
        local_138[4] = 0.0;
        local_138[5] = 0.0;
        local_138[6] = 0.0;
        local_138[7] = 0.0;
        lVar16 = 0;
        do {
          local_138[lVar16 + 4] = (float)local_f8[lVar16 + 4];
          lVar16 = lVar16 + 1;
        } while (lVar16 != 4);
        local_138[0] = 0.0;
        local_138[1] = 0.0;
        local_138[2] = 0.0;
        local_138[3] = 0.0;
        lVar16 = 0;
        do {
          local_138[lVar16] = (float)local_f8[lVar16];
          lVar16 = lVar16 + 1;
        } while (lVar16 != 4);
        if (depthValues != (float *)0x0) {
          local_1b8[0] = 0.0;
          local_1b8[1] = 0.0;
          local_1b8[2] = 0.0;
          local_1b8[3] = 0.0;
          lVar16 = 0;
          do {
            local_1b8[lVar16] = local_138[lVar16 + 0xc] + local_138[lVar16 + 4];
            lVar16 = lVar16 + 1;
          } while (lVar16 != 4);
          local_188[4] = 0.0;
          local_188[5] = 0.0;
          local_188[6] = 0.0;
          local_188[7] = 0.0;
          lVar16 = 0;
          do {
            local_188[lVar16 + 4] = local_1b8[lVar16] + local_138[lVar16];
            lVar16 = lVar16 + 1;
          } while (lVar16 != 4);
          local_1b8[0] = 0.0;
          local_1b8[1] = 0.0;
          local_1b8[2] = 0.0;
          local_1b8[3] = 0.0;
          lVar16 = 0;
          do {
            local_1b8[lVar16] = local_138[lVar16 + 4] / local_188[lVar16 + 4];
            lVar16 = lVar16 + 1;
          } while (lVar16 != 4);
          local_188[0] = 0.0;
          local_188[1] = 0.0;
          local_188[2] = 0.0;
          local_188[3] = 0.0;
          lVar16 = 0;
          do {
            local_188[lVar16] = local_138[lVar16] / local_188[lVar16 + 4];
            lVar16 = lVar16 + 1;
          } while (lVar16 != 4);
          depthValues[iVar22 * 4] = local_1b8[0] * fVar25 + local_188[0] * fVar26 + fVar1;
          depthValues[iVar22 * 4 + 1] = local_1b8[1] * fVar25 + local_188[1] * fVar26 + fVar1;
          depthValues[iVar22 * 4 + 2] = local_1b8[2] * fVar25 + local_188[2] * fVar26 + fVar1;
          depthValues[iVar22 * 4 + 3] = local_1b8[3] * fVar25 + local_188[3] * fVar26 + fVar1;
        }
        fVar2 = (this->m_v0).m_data[3];
        local_188[4] = 0.0;
        local_188[5] = 0.0;
        local_188[6] = 0.0;
        local_188[7] = 0.0;
        lVar16 = 0;
        do {
          local_188[lVar16 + 4] = local_138[lVar16 + 4] * fVar2;
          lVar16 = lVar16 + 1;
        } while (lVar16 != 4);
        fVar2 = (this->m_v1).m_data[3];
        local_1b8[0] = 0.0;
        local_1b8[1] = 0.0;
        local_1b8[2] = 0.0;
        local_1b8[3] = 0.0;
        lVar16 = 0;
        do {
          local_1b8[lVar16] = local_138[lVar16] * fVar2;
          lVar16 = lVar16 + 1;
        } while (lVar16 != 4);
        fVar2 = (this->m_v2).m_data[3];
        local_188[0] = 0.0;
        local_188[1] = 0.0;
        local_188[2] = 0.0;
        local_188[3] = 0.0;
        lVar16 = 0;
        do {
          local_188[lVar16] = local_138[lVar16 + 0xc] * fVar2;
          lVar16 = lVar16 + 1;
        } while (lVar16 != 4);
        local_1a8 = 0;
        uStack_1a0 = 0;
        lVar16 = 0;
        do {
          *(float *)((long)&local_1a8 + lVar16 * 4) = local_188[lVar16 + 4] + local_1b8[lVar16];
          lVar16 = lVar16 + 1;
        } while (lVar16 != 4);
        local_138[8] = 0.0;
        local_138[9] = 0.0;
        local_138[10] = 0.0;
        local_138[0xb] = 0.0;
        lVar16 = 0;
        do {
          local_138[lVar16 + 8] = *(float *)((long)&local_1a8 + lVar16 * 4) + local_188[lVar16];
          lVar16 = lVar16 + 1;
        } while (lVar16 != 4);
        *(ulong *)fragmentPackets[iVar22].position.m_data = CONCAT44(iVar3,iVar4);
        fragmentPackets[iVar22].coverage = uVar20 | uVar17;
        local_1a8 = 0;
        uStack_1a0 = 0;
        lVar16 = 0;
        do {
          *(float *)((long)&local_1a8 + lVar16 * 4) = local_188[lVar16 + 4] / local_138[lVar16 + 8];
          lVar16 = lVar16 + 1;
        } while (lVar16 != 4);
        *(undefined8 *)fragmentPackets[iVar22].barycentric[0].m_data = local_1a8;
        *(undefined8 *)(fragmentPackets[iVar22].barycentric[0].m_data + 2) = uStack_1a0;
        local_1a8 = 0;
        uStack_1a0 = 0;
        lVar16 = 0;
        do {
          *(float *)((long)&local_1a8 + lVar16 * 4) = local_1b8[lVar16] / local_138[lVar16 + 8];
          lVar16 = lVar16 + 1;
        } while (lVar16 != 4);
        *(undefined8 *)fragmentPackets[iVar22].barycentric[1].m_data = local_1a8;
        *(undefined8 *)(fragmentPackets[iVar22].barycentric[1].m_data + 2) = uStack_1a0;
        local_88[0] = 0.0;
        local_88[1] = 0.0;
        local_88[2] = 0.0;
        local_88[3] = 0.0;
        lVar16 = 0;
        do {
          local_88[lVar16] = 1.0 - fragmentPackets[iVar22].barycentric[0].m_data[lVar16];
          lVar16 = lVar16 + 1;
        } while (lVar16 != 4);
        local_1a8 = 0;
        uStack_1a0 = 0;
        lVar16 = 0;
        do {
          *(float *)((long)&local_1a8 + lVar16 * 4) =
               local_88[lVar16] - fragmentPackets[iVar22].barycentric[1].m_data[lVar16];
          lVar16 = lVar16 + 1;
        } while (lVar16 != 4);
        *(undefined8 *)fragmentPackets[iVar22].barycentric[2].m_data = local_1a8;
        *(undefined8 *)(fragmentPackets[iVar22].barycentric[2].m_data + 2) = uStack_1a0;
        iVar22 = iVar22 + 1;
      }
      iVar3 = (this->m_curPos).m_data[1];
    } while ((iVar3 <= (this->m_bboxMax).m_data[1]) && (iVar22 < maxFragmentPackets));
  }
  *numPacketsRasterized = iVar22;
  return;
}

Assistant:

void TriangleRasterizer::rasterizeSingleSample (FragmentPacket* const fragmentPackets, float* const depthValues, const int maxFragmentPackets, int& numPacketsRasterized)
{
	DE_ASSERT(maxFragmentPackets > 0);

	const deUint64	halfPixel	= 1ll << (RASTERIZER_SUBPIXEL_BITS-1);
	int				packetNdx	= 0;

	// For depth interpolation; given barycentrics A, B, C = (1 - A - B)
	// we can reformulate the usual z = z0*A + z1*B + z2*C into more
	// stable equation z = A*(z0 - z2) + B*(z1 - z2) + z2.
	const float		za			= m_v0.z()-m_v2.z();
	const float		zb			= m_v1.z()-m_v2.z();
	const float		zc			= m_v2.z();

	while (m_curPos.y() <= m_bboxMax.y() && packetNdx < maxFragmentPackets)
	{
		const int		x0		= m_curPos.x();
		const int		y0		= m_curPos.y();

		// Subpixel coords
		const deInt64	sx0		= toSubpixelCoord(x0)	+ halfPixel;
		const deInt64	sx1		= toSubpixelCoord(x0+1)	+ halfPixel;
		const deInt64	sy0		= toSubpixelCoord(y0)	+ halfPixel;
		const deInt64	sy1		= toSubpixelCoord(y0+1)	+ halfPixel;

		const deInt64	sx[4]	= { sx0, sx1, sx0, sx1 };
		const deInt64	sy[4]	= { sy0, sy0, sy1, sy1 };

		// Viewport test
		const bool		outX1	= x0+1 == m_viewport.x()+m_viewport.z();
		const bool		outY1	= y0+1 == m_viewport.y()+m_viewport.w();

		DE_ASSERT(x0 < m_viewport.x()+m_viewport.z());
		DE_ASSERT(y0 < m_viewport.y()+m_viewport.w());

		// Edge values
		tcu::Vector<deInt64, 4>	e01;
		tcu::Vector<deInt64, 4>	e12;
		tcu::Vector<deInt64, 4>	e20;

		// Coverage
		deUint64		coverage	= 0;

		// Evaluate edge values
		for (int i = 0; i < 4; i++)
		{
			e01[i] = evaluateEdge(m_edge01, sx[i], sy[i]);
			e12[i] = evaluateEdge(m_edge12, sx[i], sy[i]);
			e20[i] = evaluateEdge(m_edge20, sx[i], sy[i]);
		}

		// Compute coverage mask
		coverage = setCoverageValue(coverage, 1, 0, 0, 0,						isInsideCCW(m_edge01, e01[0]) && isInsideCCW(m_edge12, e12[0]) && isInsideCCW(m_edge20, e20[0]));
		coverage = setCoverageValue(coverage, 1, 1, 0, 0, !outX1 &&				isInsideCCW(m_edge01, e01[1]) && isInsideCCW(m_edge12, e12[1]) && isInsideCCW(m_edge20, e20[1]));
		coverage = setCoverageValue(coverage, 1, 0, 1, 0, !outY1 &&				isInsideCCW(m_edge01, e01[2]) && isInsideCCW(m_edge12, e12[2]) && isInsideCCW(m_edge20, e20[2]));
		coverage = setCoverageValue(coverage, 1, 1, 1, 0, !outX1 && !outY1 &&	isInsideCCW(m_edge01, e01[3]) && isInsideCCW(m_edge12, e12[3]) && isInsideCCW(m_edge20, e20[3]));

		// Advance to next location
		m_curPos.x() += 2;
		if (m_curPos.x() > m_bboxMax.x())
		{
			m_curPos.y() += 2;
			m_curPos.x()  = m_bboxMin.x();
		}

		if (coverage == 0)
			continue; // Discard.

		// Floating-point edge values for barycentrics etc.
		const tcu::Vec4		e01f	= e01.asFloat();
		const tcu::Vec4		e12f	= e12.asFloat();
		const tcu::Vec4		e20f	= e20.asFloat();

		// Compute depth values.
		if (depthValues)
		{
			const tcu::Vec4		edgeSum	= e01f + e12f + e20f;
			const tcu::Vec4		z0		= e12f / edgeSum;
			const tcu::Vec4		z1		= e20f / edgeSum;

			depthValues[packetNdx*4+0] = z0[0]*za + z1[0]*zb + zc;
			depthValues[packetNdx*4+1] = z0[1]*za + z1[1]*zb + zc;
			depthValues[packetNdx*4+2] = z0[2]*za + z1[2]*zb + zc;
			depthValues[packetNdx*4+3] = z0[3]*za + z1[3]*zb + zc;
		}

		// Compute barycentrics and write out fragment packet
		{
			FragmentPacket& packet = fragmentPackets[packetNdx];

			const tcu::Vec4		b0		= e12f * m_v0.w();
			const tcu::Vec4		b1		= e20f * m_v1.w();
			const tcu::Vec4		b2		= e01f * m_v2.w();
			const tcu::Vec4		bSum	= b0 + b1 + b2;

			packet.position			= tcu::IVec2(x0, y0);
			packet.coverage			= coverage;
			packet.barycentric[0]	= b0 / bSum;
			packet.barycentric[1]	= b1 / bSum;
			packet.barycentric[2]	= 1.0f - packet.barycentric[0] - packet.barycentric[1];

			packetNdx += 1;
		}
	}

	DE_ASSERT(packetNdx <= maxFragmentPackets);
	numPacketsRasterized = packetNdx;
}